

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O2

void __thiscall
slang::ast::ParameterBuilder::ParameterBuilder
          (ParameterBuilder *this,Scope *scope,string_view definitionName,
          span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>
          parameterDecls)

{
  this->scope = scope;
  (this->definitionName)._M_len = definitionName._M_len;
  (this->definitionName)._M_str = definitionName._M_str;
  (this->parameterDecls)._M_ptr = parameterDecls._M_ptr;
  (this->parameterDecls)._M_extent._M_extent_value =
       parameterDecls._M_extent._M_extent_value._M_extent_value;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap(&this->assignments);
  *(undefined8 *)((long)&this->overrideNode + 3) = 0;
  *(undefined8 *)((long)&this->configScope + 3) = 0;
  this->instanceContext = (ASTContext *)0x0;
  this->overrideNode = (HierarchyOverrideNode *)0x0;
  return;
}

Assistant:

ParameterBuilder::ParameterBuilder(const Scope& scope, std::string_view definitionName,
                                   std::span<const Decl> parameterDecls) :
    scope(scope), definitionName(definitionName), parameterDecls(parameterDecls) {
}